

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Runway> metaf::Runway::fromString(string *s,bool enableRwy)

{
  ulong in_RAX;
  _Storage<metaf::Runway,_true> _Var1;
  _Storage<metaf::Runway,_true> _Var2;
  undefined4 uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  uint uVar5;
  _Storage<metaf::Runway,_true> _Var6;
  optional<metaf::Runway> oVar7;
  optional<metaf::Runway> oVar8;
  
  if (s->_M_string_length < 3) {
    oVar7.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Runway>._8_4_ = 0;
    oVar7.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Runway>._M_payload = (_Storage<metaf::Runway,_true>)in_RAX;
    return (optional<metaf::Runway>)
           oVar7.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Runway>;
  }
  _Var2._M_value = (Runway)(s->_M_dataplus)._M_p;
  if (*(char *)_Var2 == 'R') {
    uVar5 = 1;
    if ((enableRwy) && (*(char *)((long)_Var2 + 1) == 'W')) {
      uVar5 = (uint)(*(char *)((long)_Var2 + 2) == 'Y') * 2 + 1;
    }
    _Var1._M_value = (Runway)strToUint(s,(ulong)uVar5,2);
    _Var2._M_value = _Var1._M_value;
    if ((((ulong)_Var1 >> 0x20 & 1) != 0) &&
       (_Var2 = (_Storage<metaf::Runway,_true>)s->_M_string_length, _Var6._0_4_ = uVar5 + 3,
       _Var6._M_value.rDesignator = 0, (ulong)_Var2 <= (ulong)_Var6)) {
      _Var6 = (_Storage<metaf::Runway,_true>)((ulong)uVar5 + 2);
      if ((ulong)_Var6 < (ulong)_Var2) {
        _Var2._M_value = (Runway)designatorFromChar((s->_M_dataplus)._M_p[(long)_Var6]);
        uVar4 = extraout_RDX_00;
        if (((ulong)_Var2 & 0x100000000) == 0) goto LAB_0018945d;
      }
      else {
        _Var2 = (_Storage<metaf::Runway,_true>)0x0;
        uVar4 = extraout_RDX;
      }
      _Var2 = (_Storage<metaf::Runway,_true>)((ulong)_Var1 & 0xffffffff | (long)_Var2 << 0x20);
      uVar3 = (undefined4)CONCAT71((int7)((ulong)uVar4 >> 8),1);
      goto LAB_0018945f;
    }
  }
LAB_0018945d:
  uVar3 = 0;
LAB_0018945f:
  oVar8.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._8_4_ = uVar3;
  oVar8.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload = _Var2;
  return (optional<metaf::Runway>)
         oVar8.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Runway>;
}

Assistant:

std::optional<Runway> Runway::fromString(const std::string & s, bool enableRwy) {
	//static const std::regex rgx("R(?:WY)?(\\d\\d)([RLC])?");
	static const std::optional<Runway> error;
	if (s.length() < 3) return error;
	if (s[0] != 'R') return error;
	auto numPos = 1u;
	if (enableRwy && s[1] == 'W' && s[2] == 'Y') numPos += 2;
	const auto rwyNum = strToUint(s, numPos, 2);
	if (!rwyNum.has_value()) return error;
	const auto dsgPos = numPos + 2;
	if (s.length() > dsgPos + 1) return error;
	Runway runway;
	runway.rNumber = *rwyNum;
	if ( s.length() > dsgPos) {
		const auto designator = designatorFromChar(s[dsgPos]);
		if (!designator.has_value()) return error;
		runway.rDesignator = *designator;
	}
	return runway;
}